

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> * __thiscall
spvtools::opt::MergeReturnPass::CollectReturnBlocks
          (vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
           *__return_storage_ptr__,MergeReturnPass *this,Function *function)

{
  pointer puVar1;
  Function *pFVar2;
  Function *in_RAX;
  pointer puVar3;
  Function *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (function->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = in_RAX;
  for (puVar3 = (function->blocks_).
                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pFVar2 = (Function *)
             (puVar3->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    BasicBlock::tail((BasicBlock *)&stack0xffffffffffffffc8);
    if (*(int *)&(local_38->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
                 sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.
                 _vptr_IntrusiveNodeBase - 0xfdU < 2) {
      local_38 = pFVar2;
      std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
      emplace_back<spvtools::opt::BasicBlock*>
                ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
                 __return_storage_ptr__,(BasicBlock **)&stack0xffffffffffffffc8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BasicBlock*> MergeReturnPass::CollectReturnBlocks(
    Function* function) {
  std::vector<BasicBlock*> return_blocks;
  for (auto& block : *function) {
    Instruction& terminator = *block.tail();
    if (terminator.opcode() == spv::Op::OpReturn ||
        terminator.opcode() == spv::Op::OpReturnValue) {
      return_blocks.push_back(&block);
    }
  }
  return return_blocks;
}